

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

string * __thiscall
google::protobuf::internal::WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::
MakeInvalidEmbeddedMessage_abi_cxx11_
          (string *__return_storage_ptr__,
          WireFormatInvalidInputTest<proto2_unittest::TestAllTypes> *this,char *bytes,int size)

{
  int field_number;
  Descriptor *this_00;
  FieldDescriptor *pFVar1;
  string_view name;
  string local_a0;
  StringOutputStream raw_output;
  CodedOutputStream output;
  
  this_00 = proto2_unittest::TestAllTypes::GetDescriptor();
  name._M_str = "optional_nested_message";
  name._M_len = 0x17;
  pFVar1 = Descriptor::FindFieldByName(this_00,name);
  if (pFVar1 != (FieldDescriptor *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    io::StringOutputStream::StringOutputStream(&raw_output,__return_storage_ptr__);
    io::CodedOutputStream::CodedOutputStream<google::protobuf::io::StringOutputStream,void>
              (&output,&raw_output);
    field_number = pFVar1->number_;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,bytes,bytes + size);
    WireFormatLite::WriteBytes(field_number,&local_a0,&output);
    std::__cxx11::string::~string((string *)&local_a0);
    io::CodedOutputStream::~CodedOutputStream(&output);
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&output,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
             ,0x52c,"field != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&output);
}

Assistant:

std::string MakeInvalidEmbeddedMessage(const char* bytes, int size) {
    const FieldDescriptor* field =
        TestAllTypes::descriptor()->FindFieldByName("optional_nested_message");
    ABSL_CHECK(field != nullptr);

    std::string result;

    {
      io::StringOutputStream raw_output(&result);
      io::CodedOutputStream output(&raw_output);

      WireFormatLite::WriteBytes(field->number(), std::string(bytes, size),
                                 &output);
    }

    return result;
  }